

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

void __thiscall Json::Path::makePath(Path *this,string *path,InArgs *in)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  value_type *pvVar3;
  void *pvVar4;
  pointer ppPVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  allocator<char> local_89;
  Path *local_88;
  InArgs *local_80;
  PathArgument local_78;
  long *local_50 [2];
  long local_40 [2];
  
  if (path->_M_string_length != 0) {
    pbVar7 = (byte *)(path->_M_dataplus)._M_p;
    pbVar6 = pbVar7 + path->_M_string_length;
    ppPVar5 = (in->
              super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_88 = this;
    local_80 = in;
    do {
      bVar2 = *pbVar7;
      pbVar8 = pbVar7;
      if (bVar2 < 0x5b) {
        if (bVar2 == 0x25) {
          if ((ppPVar5 !=
               (local_80->
               super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
               )._M_impl.super__Vector_impl_data._M_finish) &&
             (pvVar3 = *ppPVar5, pvVar3->kind_ == kindKey)) {
            ppPVar5 = ppPVar5 + 1;
            std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::push_back
                      (&local_88->args_,pvVar3);
          }
        }
        else if (bVar2 != 0x2e) {
joined_r0x004d5552:
          while ((pbVar8 != pbVar6 &&
                 (pvVar4 = memchr("[.",(int)(char)*pbVar8,3), pvVar4 == (void *)0x0))) {
            pbVar8 = pbVar8 + 1;
          }
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pbVar7,pbVar8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_78,(char *)local_50[0],&local_89);
          local_78.index_ = 0;
          local_78.kind_ = kindKey;
          std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::
          emplace_back<Json::PathArgument>(&local_88->args_,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78.key_._M_dataplus._M_p != &local_78.key_.field_2) {
            operator_delete(local_78.key_._M_dataplus._M_p,
                            CONCAT71(local_78.key_.field_2._M_allocated_capacity._1_7_,
                                     local_78.key_.field_2._M_local_buf[0]) + 1);
          }
          pbVar7 = pbVar8;
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          goto LAB_004d56ee;
        }
LAB_004d562e:
        pbVar7 = pbVar7 + 1;
      }
      else {
        if (bVar2 != 0x5b) {
          if (bVar2 != 0x5d) goto joined_r0x004d5552;
          goto LAB_004d562e;
        }
        pbVar8 = pbVar7 + 1;
        if (pbVar7[1] == 0x25) {
          if ((ppPVar5 !=
               (local_80->
               super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
               )._M_impl.super__Vector_impl_data._M_finish) &&
             (pvVar3 = *ppPVar5, pvVar3->kind_ == kindIndex)) {
            ppPVar5 = ppPVar5 + 1;
            std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::push_back
                      (&local_88->args_,pvVar3);
          }
        }
        else {
          paVar1 = &local_78.key_.field_2;
          if (pbVar8 == pbVar6) {
            local_78.index_ = 0;
          }
          else {
            local_78.index_ = 0;
            do {
              if (9 < (byte)(*pbVar8 - 0x30)) break;
              local_78.index_ = (uint)(byte)(*pbVar8 - 0x30) + local_78.index_ * 10;
              pbVar8 = pbVar8 + 1;
            } while (pbVar8 != pbVar6);
          }
          local_78.key_._M_string_length = 0;
          local_78.key_.field_2._M_local_buf[0] = '\0';
          local_78.kind_ = kindIndex;
          local_78.key_._M_dataplus._M_p = (pointer)paVar1;
          std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::
          emplace_back<Json::PathArgument>(&local_88->args_,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78.key_._M_dataplus._M_p != paVar1) {
            operator_delete(local_78.key_._M_dataplus._M_p,
                            CONCAT71(local_78.key_.field_2._M_allocated_capacity._1_7_,
                                     local_78.key_.field_2._M_local_buf[0]) + 1);
          }
        }
        pbVar7 = pbVar8 + (pbVar8 != pbVar6);
      }
LAB_004d56ee:
    } while (pbVar7 != pbVar6);
  }
  return;
}

Assistant:

void Path::makePath(const JSONCPP_STRING& path, const InArgs& in) {
  const char* current = path.c_str();
  const char* end = current + path.length();
  InArgs::const_iterator itInArg = in.begin();
  while (current != end) {
    if (*current == '[') {
      ++current;
      if (*current == '%')
        addPathInArg(path, in, itInArg, PathArgument::kindIndex);
      else {
        ArrayIndex index = 0;
        for (; current != end && *current >= '0' && *current <= '9'; ++current)
          index = index * 10 + ArrayIndex(*current - '0');
        args_.push_back(index);
      }
      if (current == end || *++current != ']')
        invalidPath(path, int(current - path.c_str()));
    } else if (*current == '%') {
      addPathInArg(path, in, itInArg, PathArgument::kindKey);
      ++current;
    } else if (*current == '.' || *current == ']') {
      ++current;
    } else {
      const char* beginName = current;
      while (current != end && !strchr("[.", *current))
        ++current;
      args_.push_back(JSONCPP_STRING(beginName, current));
    }
  }
}